

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall pbrt::Disk::Intersect(Disk *this,Ray *ray,Float tMax)

{
  undefined1 auVar1 [16];
  bool bVar2;
  QuadricIntersection *pQVar3;
  optional<pbrt::ShapeIntersection> *in_RDI;
  undefined8 uVar4;
  Vector3<float> VVar5;
  Float in_stack_0000006c;
  QuadricIntersection *in_stack_00000070;
  Disk *in_stack_00000078;
  Tuple3<pbrt::Vector3,_float> in_stack_00000090;
  SurfaceInteraction intr;
  optional<pbrt::QuadricIntersection> isect;
  ShapeIntersection *in_stack_fffffffffffffd48;
  SurfaceInteraction *in_stack_fffffffffffffd50;
  optional<pbrt::ShapeIntersection> *this_00;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  optional local_34 [52];
  
  uVar4 = 0;
  BasicIntersect((Disk *)in_stack_ffffffffffffff28,(Ray *)in_stack_ffffffffffffff20,
                 (Float)in_stack_ffffffffffffff1c);
  bVar2 = pstd::optional::operator_cast_to_bool(local_34);
  if (bVar2) {
    pstd::optional<pbrt::QuadricIntersection>::operator*
              ((optional<pbrt::QuadricIntersection> *)0x6beaa9);
    VVar5 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffd50);
    local_160 = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar1._8_8_ = uVar4;
    auVar1._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_168 = vmovlpd_avx(auVar1);
    local_158 = local_168;
    local_150 = local_160;
    local_148 = local_168;
    local_140 = local_160;
    InteractionFromIntersection
              (in_stack_00000078,in_stack_00000070,(Vector3f)in_stack_00000090,in_stack_0000006c);
    SurfaceInteraction::SurfaceInteraction
              (in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->intr);
    this_00 = (optional<pbrt::ShapeIntersection> *)&stack0xfffffffffffffe90;
    pQVar3 = pstd::optional<pbrt::QuadricIntersection>::operator->
                       ((optional<pbrt::QuadricIntersection> *)0x6beb8f);
    *(Float *)&this_00->optionalValue = pQVar3->tHit;
    pstd::optional<pbrt::ShapeIntersection>::optional(this_00,in_stack_fffffffffffffd48);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  pstd::optional<pbrt::QuadricIntersection>::~optional
            ((optional<pbrt::QuadricIntersection> *)0x6bebf6);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeIntersection> Intersect(const Ray &ray,
                                                Float tMax = Infinity) const {
        pstd::optional<QuadricIntersection> isect = BasicIntersect(ray, tMax);
        if (!isect)
            return {};
        SurfaceInteraction intr = InteractionFromIntersection(*isect, -ray.d, ray.time);
        return ShapeIntersection{intr, isect->tHit};
    }